

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

RunResult __thiscall
wabt::interp::Thread::
DoSimdConvert<wabt::interp::Simd<unsigned_int,(unsigned_char)4>,wabt::interp::Simd<unsigned_short,(unsigned_char)8>,true>
          (Thread *this)

{
  undefined1 auVar1 [14];
  undefined1 auVar2 [14];
  undefined1 auVar3 [14];
  undefined1 auVar4 [14];
  Value VVar5;
  
  VVar5 = Pop(this);
  auVar1._8_4_ = 0;
  auVar1._0_8_ = VVar5.field_0.i64_;
  auVar1._12_2_ = VVar5.field_0._6_2_;
  auVar2._8_2_ = VVar5.field_0._4_2_;
  auVar2._0_8_ = VVar5.field_0.i64_;
  auVar2._10_4_ = auVar1._10_4_;
  auVar4._6_8_ = 0;
  auVar4._0_6_ = auVar2._8_6_;
  auVar3._6_8_ = SUB148(auVar4 << 0x40,6);
  auVar3._4_2_ = VVar5.field_0._2_2_;
  auVar3._2_2_ = 0;
  auVar3._0_2_ = VVar5.field_0._0_2_;
  VVar5.field_0._0_8_ = auVar3._0_8_;
  VVar5.field_0._12_4_ = auVar1._10_4_ >> 0x10;
  VVar5.field_0._8_4_ = auVar2._8_4_;
  Push(this,VVar5);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdConvert() {
  using SL = typename S::LaneType;
  auto val = Pop<T>();
  S result;
  for (u8 i = 0; i < S::lanes; ++i) {
    result[i] = Convert<SL>(val[(low ? 0 : S::lanes) + i]);
  }
  Push(result);
  return RunResult::Ok;
}